

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

void duckdb_zstd::ZSTD_freeCCtxContent(ZSTD_CCtx *cctx)

{
  void *ptr;
  
  ZSTD_clearAllDicts(cctx);
  ptr = (cctx->workspace).workspace;
  (cctx->workspace).objectEnd = (void *)0x0;
  (cctx->workspace).tableEnd = (void *)0x0;
  (cctx->workspace).tableValidEnd = (void *)0x0;
  (cctx->workspace).allocStart = (void *)0x0;
  (cctx->workspace).initOnceStart = (void *)0x0;
  (cctx->workspace).allocFailed = '\0';
  *(undefined3 *)&(cctx->workspace).field_0x39 = 0;
  (cctx->workspace).workspaceOversizedDuration = 0;
  (cctx->workspace).workspace = (void *)0x0;
  (cctx->workspace).workspaceEnd = (void *)0x0;
  (cctx->workspace).phase = ZSTD_cwksp_alloc_objects;
  (cctx->workspace).isStatic = ZSTD_cwksp_dynamic_alloc;
  ZSTD_customFree(ptr,cctx->customMem);
  return;
}

Assistant:

static void ZSTD_freeCCtxContent(ZSTD_CCtx* cctx)
{
    assert(cctx != NULL);
    assert(cctx->staticSize == 0);
    ZSTD_clearAllDicts(cctx);
#ifdef ZSTD_MULTITHREAD
    ZSTDMT_freeCCtx(cctx->mtctx); cctx->mtctx = NULL;
#endif
    ZSTD_cwksp_free(&cctx->workspace, cctx->customMem);
}